

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::truncSatToUI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Type *__return_storage_ptr___00;
  long lVar1;
  Literal *this_00;
  undefined1 local_a0 [8];
  LaneArray<4> lanes;
  
  getLanesF32x4((LaneArray<4> *)local_a0,this);
  __return_storage_ptr___00 = &lanes._M_elems[3].type;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    this_00 = (Literal *)(local_a0 + lVar1);
    truncSatToUI32((Literal *)__return_storage_ptr___00,this_00);
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)local_a0);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToUI32x4() const {
  return unary<4, &Literal::getLanesF32x4, &Literal::truncSatToUI32>(*this);
}